

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O1

int __thiscall CAPSFile::CreateData(CAPSFile *this,IDisk *disk,int side,uint tr,int datakey)

{
  pointer *ppaVar1;
  pointer *ppaVar2;
  uchar *puVar3;
  undefined8 *puVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  MFMTrack *pMVar8;
  iterator __position;
  undefined8 uVar9;
  EncoderSpsBlockDescriptor EVar10;
  uint uVar11;
  byte bVar12;
  uchar byte;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uchar *puVar17;
  uint extraout_var;
  void *pvVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  int nb_byte_to_add;
  ulong uVar22;
  anon_struct_80_16_0595f1fa *paVar23;
  CAPSFile *pCVar24;
  iterator __position_00;
  int iVar25;
  iterator it;
  undefined8 *puVar26;
  uint *puVar27;
  ulong __n;
  byte bVar28;
  undefined1 auVar29 [16];
  vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>
  list_block_descriptor;
  DataChunks data_chunk;
  StreamRecording gap_data;
  StreamRecording data;
  uchar pattern_byte [16];
  int local_154;
  undefined1 local_148 [16];
  anon_struct_32_7_d903e6a6 *local_138;
  anon_struct_36_6_d3f54bdf local_128;
  Side *local_f8;
  StreamRecording local_f0;
  uint local_e0;
  int local_dc;
  anon_struct_32_7_d903e6a6 local_d8;
  anon_struct_80_16_0595f1fa local_b8;
  StreamRecording local_60;
  CAPSFile *local_50;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  undefined8 local_38;
  
  bVar28 = 0;
  local_60.offset = 0;
  local_e0 = datakey;
  local_50 = this;
  local_60.buffer = (uchar *)operator_new__(0x80);
  local_60.size = 0x80;
  local_f0.offset = 0;
  local_f0.buffer = (uchar *)operator_new__(0x80);
  local_f0.size = 0x80;
  local_138 = (anon_struct_32_7_d903e6a6 *)0x0;
  local_148 = (undefined1  [16])0x0;
  local_b8.reserved = SUB1612((undefined1  [16])0x0,4);
  local_128.header.type[0] = '\0';
  local_128.header.type[1] = '\0';
  local_128.header.type[2] = '\0';
  local_128.header.type[3] = '\0';
  local_128.header.length = 0;
  local_128.header.crc = 0;
  local_128.size = 0;
  local_128.bit_size = 0;
  local_128.data_crc = 0;
  local_128.data_id = 0;
  local_128.buffer._0_4_ = 0;
  local_128.buffer._4_4_ = 0;
  local_b8.header = (RecordHeader)ZEXT812(0x5045474d49);
  local_b8.track_number = tr;
  local_b8.density = 2;
  local_b8.signal_type = 1;
  local_b8.track_flags = 0;
  local_b8.data_key = 0;
  local_b8.gap_bits = 0;
  local_b8.track_bits = 0;
  local_b8.block_count = 0;
  local_b8.encoder_process = 0;
  local_b8.track_byte = 0;
  local_b8.start_byte_pos = 0;
  local_b8.data_bits = 0;
  if ((side < (int)(uint)disk->nb_sides_) && (tr < disk->side_[side].nb_tracks)) {
    bVar13 = false;
  }
  else {
    local_b8.density = 1;
    bVar13 = true;
  }
  if (bVar13) {
LAB_0012fbc5:
    puVar17 = (uchar *)0x0;
  }
  else {
    puVar17 = disk->side_[side].tracks[tr].bitfield;
    if (puVar17 == (uchar *)0x0) {
      local_b8.density = 1;
      bVar13 = true;
      goto LAB_0012fbc5;
    }
  }
  local_b8.start_bit_pos = 0;
  local_b8.side = side;
  if (!bVar13) {
    uVar14 = FindNextPattern(puVar17,disk->side_[side].tracks[tr].size,0,"R$R$R$",6);
    if (uVar14 == 0xffffffff) {
      uVar14 = FindNextSector(puVar17,disk->side_[side].tracks[tr].size,0,8);
      if (uVar14 == 0xffffffff) {
        local_b8.start_bit_pos = 0;
        local_b8.density = 1;
        bVar13 = true;
        goto LAB_0012fc3b;
      }
    }
    local_b8.start_byte_pos = uVar14 >> 3;
    local_b8.start_bit_pos = uVar14;
  }
LAB_0012fc3b:
  if (!bVar13) {
    pMVar8 = disk->side_[side].tracks;
    puVar17 = (uchar *)operator_new__((ulong)pMVar8[tr].size);
    uVar14 = local_b8.start_bit_pos;
    puVar27 = &pMVar8[tr].size;
    uVar22 = (ulong)local_b8.start_bit_pos;
    memcpy(puVar17,pMVar8[tr].bitfield + uVar22,(ulong)(*puVar27 - local_b8.start_bit_pos));
    memcpy(puVar17 + (*puVar27 - uVar14),pMVar8[tr].bitfield,uVar22);
    uVar14 = 0;
    local_154 = 0;
    if (*puVar27 != 0x10) {
      uVar15 = *puVar27 - 0x11;
      local_154 = 0;
      do {
        if ((*(long *)(puVar17 + (uVar15 + 1)) != 0x1000100010001 ||
             *(long *)(puVar17 + (ulong)(uVar15 + 1) + 8) != 0x1000100010001) ||
           (puVar17[uVar15] == '\x01')) break;
        local_154 = local_154 + 1;
        uVar15 = uVar15 - 0x10;
      } while (uVar15 != 0xffffffff);
    }
    local_f8 = disk->side_ + side;
    local_dc = local_154 << 4;
    do {
      local_d8.encoder_type = 0;
      local_d8.block_flag = 0;
      local_d8.gap_value = 0;
      local_d8.block_bits = 0;
      local_d8.gap_bits = 0;
      local_d8.sps_specific.cell_type = 0;
      local_d8.data_offset = local_60.offset;
      local_d8.sps_specific.gap_offset = local_f0.offset;
      local_38._0_4_ = FindNextSector(puVar17,local_f8->tracks[tr].size,uVar14 + 1,8);
      local_38._4_4_ = extraout_var;
      if ((uint)local_38 == 0xffffffff) {
        uVar22 = (ulong)((local_f8->tracks[tr].size - local_dc) - 0x10);
        iVar25 = local_154;
      }
      else {
        uVar15 = (uint)local_38 - 0x10;
        iVar25 = 0;
        if (uVar14 < uVar15) {
          iVar25 = 0;
          uVar11 = (uint)local_38 - 0x11;
          do {
            uVar20 = uVar11;
            uVar22 = (ulong)(uVar20 + 1);
            if (*(long *)(puVar17 + uVar22) != 0x1000100010001 ||
                *(long *)(puVar17 + uVar22 + 8) != 0x1000100010001) goto LAB_0012fde8;
            if (puVar17[uVar20] == '\x01') goto LAB_0012fdc8;
            iVar25 = iVar25 + 1;
            uVar15 = uVar15 - 0x10;
            uVar11 = uVar20 - 0x10;
          } while (uVar14 < uVar20 - 0xf);
          uVar22 = (ulong)(uVar20 - 0xf);
        }
        else {
LAB_0012fdc8:
          uVar22 = (ulong)uVar15;
        }
      }
LAB_0012fde8:
      uVar15 = (uint)uVar22;
      _local_48 = *(_func_int ***)(puVar17 + (int)uVar15);
      _uStack_40 = *(undefined8 *)(puVar17 + (int)uVar15 + 8);
      iVar16 = (*local_50->_vptr_CAPSFile[10])(local_50,&stack0xffffffffffffffb8,0x10);
      nb_byte_to_add = 0;
      if ((char)iVar16 == '\x01' && uVar14 < uVar15) {
        nb_byte_to_add = 0;
        do {
          uVar15 = (uint)uVar22;
          puVar3 = puVar17 + uVar22;
          auVar29[0] = -(*puVar3 == local_48);
          auVar29[1] = -(puVar3[1] == uStack_47);
          auVar29[2] = -(puVar3[2] == uStack_46);
          auVar29[3] = -(puVar3[3] == uStack_45);
          auVar29[4] = -(puVar3[4] == uStack_44);
          auVar29[5] = -(puVar3[5] == uStack_43);
          auVar29[6] = -(puVar3[6] == uStack_42);
          auVar29[7] = -(puVar3[7] == uStack_41);
          auVar29[8] = -(puVar3[8] == uStack_40);
          auVar29[9] = -(puVar3[9] == uStack_3f);
          auVar29[10] = -(puVar3[10] == uStack_3e);
          auVar29[0xb] = -(puVar3[0xb] == uStack_3d);
          auVar29[0xc] = -(puVar3[0xc] == uStack_3c);
          auVar29[0xd] = -(puVar3[0xd] == uStack_3b);
          auVar29[0xe] = -(puVar3[0xe] == uStack_3a);
          auVar29[0xf] = -(puVar3[0xf] == uStack_39);
          if ((((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar29[0xf] >> 7) << 0xf) != 0xffff) ||
              (((bVar12 = puVar17[uVar15 - 1] & puVar17[uVar22], uVar14 < uVar15 - 1 &&
                (bVar12 == 1)) || ((puVar17[uVar15 + 1] & bVar12) != 1)))) ||
             ((1 < uVar15 && ((bVar12 & puVar17[uVar15 - 2]) != 1)))) break;
          uVar15 = uVar15 - 0x10;
          uVar22 = (ulong)uVar15;
          nb_byte_to_add = nb_byte_to_add + 1;
        } while (uVar14 < uVar15);
      }
      pCVar24 = (CAPSFile *)&stack0xffffffffffffffb8;
      byte = IDisk::ConvertMFMToByte((uchar *)pCVar24);
      AddGapRecord(pCVar24,&local_f0,nb_byte_to_add,byte);
      local_d8.gap_bits = local_d8.gap_bits + nb_byte_to_add * 0x10;
      if (iVar25 != 0) {
        AddGapRecord(pCVar24,&local_f0,iVar25,'\0');
        local_d8.gap_bits = local_d8.gap_bits + iVar25 * 0x10;
        local_b8.gap_bits = local_b8.gap_bits + iVar25 * 0x10;
        local_b8.track_byte = local_b8.track_byte + iVar25 * 2;
        local_d8.block_flag = local_d8.block_flag | 2;
      }
      local_b8.gap_bits = local_b8.gap_bits + nb_byte_to_add * 0x10;
      local_b8.track_byte = local_b8.track_byte + nb_byte_to_add * 2;
      if (nb_byte_to_add != 0) {
        local_d8.block_flag = local_d8.block_flag | 1;
      }
      bVar13 = AddStreamRecord(pCVar24,&local_60,puVar17,uVar14,uVar15 + 0x10,
                               local_f8->tracks[tr].size);
      local_d8.block_bits = (uVar15 + 0x10) - uVar14;
      local_b8.data_bits = local_b8.data_bits + local_d8.block_bits;
      local_b8.track_byte = local_b8.track_byte + (local_d8.block_bits + 7 >> 3);
      local_d8.sps_specific.cell_type = 1;
      local_d8.encoder_type = 1;
      if (!bVar13) {
        local_d8.block_flag = local_d8.block_flag | 4;
      }
      local_d8.gap_value = 0x4e;
      if ((anon_struct_32_7_d903e6a6 *)local_148._8_8_ == local_138) {
        std::vector<CAPSFile::BlockDescriptor,std::allocator<CAPSFile::BlockDescriptor>>::
        _M_realloc_insert<CAPSFile::BlockDescriptor_const&>
                  ((vector<CAPSFile::BlockDescriptor,std::allocator<CAPSFile::BlockDescriptor>> *)
                   local_148,(iterator)local_148._8_8_,&local_d8);
      }
      else {
        EVar10.cell_type = 1;
        EVar10.gap_offset = local_d8.sps_specific.gap_offset;
        *(ulong *)(local_148._8_8_ + 0x10) = CONCAT44(local_d8.block_flag,1);
        *(ulong *)(local_148._8_8_ + 0x18) = CONCAT44(local_d8.data_offset,0x4e);
        *(ulong *)local_148._8_8_ = CONCAT44(local_d8.gap_bits,local_d8.block_bits);
        *(EncoderSpsBlockDescriptor *)(local_148._8_8_ + 8) = EVar10;
        local_148._8_8_ = (anon_struct_32_7_d903e6a6 *)(local_148._8_8_ + 0x20);
      }
      local_b8.block_count = local_b8.block_count + 1;
      uVar14 = (uint)local_38;
    } while (uVar14 != 0xffffffff);
    operator_delete__(puVar17);
  }
  builtin_memcpy(local_128.header.type,"DATA",4);
  local_128.header.length = 0x1c;
  puVar26 = (undefined8 *)local_148._0_8_;
  uVar14 = local_148._8_4_ - local_148._0_4_ & 0xffffffe0;
  uVar22 = (ulong)local_f0.offset;
  iVar25 = local_f0.offset + uVar14;
  __n = (ulong)local_60.offset;
  uVar15 = local_60.offset + iVar25;
  local_128.size = uVar15;
  local_128.bit_size = uVar15 * 8;
  pvVar18 = operator_new__((ulong)uVar15);
  puVar17 = local_f0.buffer;
  local_128.buffer._0_4_ = SUB84(pvVar18,0);
  local_128.buffer._4_4_ = (undefined4)((ulong)pvVar18 >> 0x20);
  if (puVar26 != (undefined8 *)local_148._8_8_) {
    lVar19 = 0;
    do {
      *(uint *)(puVar26 + 1) = *(int *)(puVar26 + 1) + uVar14;
      *(int *)((long)puVar26 + 0x1c) = *(int *)((long)puVar26 + 0x1c) + iVar25;
      lVar19 = (long)(int)lVar19;
      uVar9 = puVar26[3];
      puVar4 = (undefined8 *)((long)pvVar18 + lVar19 + 0x10);
      *puVar4 = puVar26[2];
      puVar4[1] = uVar9;
      uVar9 = puVar26[1];
      *(undefined8 *)((long)pvVar18 + lVar19) = *puVar26;
      ((undefined8 *)((long)pvVar18 + lVar19))[1] = uVar9;
      uVar21 = 0xfffffffffffffffc;
      do {
        uVar5 = *(undefined1 *)((long)pvVar18 + uVar21 + lVar19 + 4);
        uVar6 = *(undefined1 *)((long)pvVar18 + uVar21 + lVar19 + 5);
        uVar7 = *(undefined1 *)((long)pvVar18 + uVar21 + lVar19 + 6);
        *(undefined1 *)((long)pvVar18 + uVar21 + lVar19 + 4) =
             *(undefined1 *)((long)pvVar18 + uVar21 + lVar19 + 7);
        *(undefined1 *)((long)pvVar18 + uVar21 + lVar19 + 5) = uVar7;
        *(undefined1 *)((long)pvVar18 + uVar21 + lVar19 + 6) = uVar6;
        *(undefined1 *)((long)pvVar18 + uVar21 + lVar19 + 7) = uVar5;
        uVar21 = uVar21 + 4;
      } while (uVar21 < 0x1c);
      lVar19 = lVar19 + 0x20;
      puVar26 = puVar26 + 4;
    } while (puVar26 != (undefined8 *)local_148._8_8_);
  }
  memcpy((void *)((long)(int)uVar14 + (long)pvVar18),local_f0.buffer,uVar22);
  puVar3 = local_60.buffer;
  memcpy((void *)((long)iVar25 + CONCAT44(local_128.buffer._4_4_,local_128.buffer._0_4_)),
         local_60.buffer,__n);
  local_b8.data_key = local_e0;
  local_128.data_id = local_e0;
  local_128.data_crc =
       CRC::ComputeCrc32(0xedb88320,(uchar *)CONCAT44(local_128.buffer._4_4_,local_128.buffer._0_4_)
                         ,local_128.size);
  pCVar24 = local_50;
  local_b8.track_bits = local_b8.data_bits + local_b8.gap_bits;
  uVar14 = CRC::ComputeCrc32(0xedb88320,(uchar *)&local_b8,0x50);
  local_b8.header.crc =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  __position_00._M_current =
       (pCVar24->list_imge_).
       super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (pCVar24->list_imge_).
      super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<CAPSFile::ImgeItem,std::allocator<CAPSFile::ImgeItem>>::
    _M_realloc_insert<CAPSFile::ImgeItem_const&>
              ((vector<CAPSFile::ImgeItem,std::allocator<CAPSFile::ImgeItem>> *)&pCVar24->list_imge_
               ,__position_00,&local_b8);
  }
  else {
    paVar23 = &local_b8;
    for (lVar19 = 0x14; lVar19 != 0; lVar19 = lVar19 + -1) {
      *(undefined4 *)((__position_00._M_current)->header).type =
           *(undefined4 *)(paVar23->header).type;
      paVar23 = (anon_struct_80_16_0595f1fa *)((long)paVar23 + ((ulong)bVar28 * -2 + 1) * 4);
      __position_00._M_current = __position_00._M_current + (ulong)bVar28 * -8 + 4;
    }
    ppaVar1 = &(pCVar24->list_imge_).
               super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  auVar29 = (undefined1  [16])local_128._0_16_;
  __position._M_current =
       (pCVar24->list_data_).
       super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pCVar24->list_data_).
      super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<CAPSFile::DataChunks,std::allocator<CAPSFile::DataChunks>>::
    _M_realloc_insert<CAPSFile::DataChunks_const&>
              ((vector<CAPSFile::DataChunks,std::allocator<CAPSFile::DataChunks>> *)
               &pCVar24->list_data_,__position,&local_128);
  }
  else {
    *(undefined4 *)((long)&(__position._M_current)->buffer + 4) = local_128.buffer._4_4_;
    (__position._M_current)->bit_size = local_128.bit_size;
    (__position._M_current)->data_crc = local_128.data_crc;
    *(ulong *)&(__position._M_current)->data_id = CONCAT44(local_128.buffer._0_4_,local_128.data_id)
    ;
    ((__position._M_current)->header).type[0] = local_128.header.type[0];
    ((__position._M_current)->header).type[1] = local_128.header.type[1];
    ((__position._M_current)->header).type[2] = local_128.header.type[2];
    ((__position._M_current)->header).type[3] = local_128.header.type[3];
    ((__position._M_current)->header).length = local_128.header.length;
    *(undefined8 *)&((__position._M_current)->header).crc = local_128._8_8_;
    ppaVar2 = &(pCVar24->list_data_).
               super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppaVar2 = *ppaVar2 + 1;
    local_128._0_16_ = auVar29;
  }
  if (puVar3 != (uchar *)0x0) {
    operator_delete__(puVar3);
  }
  if (puVar17 != (uchar *)0x0) {
    operator_delete__(puVar17);
  }
  if ((void *)local_148._0_8_ != (void *)0x0) {
    operator_delete((void *)local_148._0_8_,(long)local_138 - local_148._0_8_);
  }
  return 0;
}

Assistant:

int CAPSFile::CreateData(IDisk* disk, int side, unsigned int tr, int datakey)
{
   // Create IMGE and data structure
   ImgeItem imge_item;
   DataChunks data_chunk;

   bool abort = false;

   StreamRecording gap_data;
   StreamRecording data;
   data.offset = 0;
   data.buffer = new unsigned char[128];
   data.size = 128;

   gap_data.offset = 0;
   gap_data.buffer = new unsigned char[128];
   gap_data.size = 128;

   int gap_offset = 0;
   //unsigned char* pData = new unsigned char[128];
   int max_size_data = 128;

   // Block descriptor vector
   std::vector<BlockDescriptor> list_block_descriptor;


   memset(&imge_item, 0, sizeof(imge_item));
   memset(&data_chunk, 0, sizeof(data_chunk));

   // &disk->m_Disk[side].Tracks[tr]);

   ////////////
   // IMGE
   memcpy(imge_item.header.type, "IMGE", 4);
   imge_item.header.crc = 0;
   imge_item.header.length = 0x50;
   imge_item.track_number = tr;
   imge_item.side = side;
   imge_item.density = 2; // auto
   imge_item.signal_type = 1; // 2us cell
   imge_item.track_byte = 0; //
   imge_item.start_byte_pos = 0;
   imge_item.start_bit_pos = 0;
   imge_item.data_bits = 0;
   imge_item.gap_bits = 0;
   imge_item.track_bits = 0;
   imge_item.block_count = 0;
   imge_item.encoder_process = 0; // 0
   imge_item.track_flags = 0;
   imge_item.data_key = 0;

   // Nothing on this side / track ?
   if (side >= disk->nb_sides_ || tr >= disk->side_[side].nb_tracks)
   {
      imge_item.start_bit_pos = 0;
      imge_item.density = 1;
      abort = true;
      //goto End;//return 0;
   }

   unsigned char* track_field = nullptr;
   if (!abort)
   {
      track_field = disk->side_[side].tracks[tr].bitfield;
      // DATA
      if (track_field == NULL)
      {
         imge_item.start_bit_pos = 0;
         imge_item.density = 1;
         abort = true;
         //goto End;//return 0;
      }
   }

   unsigned int startbitpos = 0;
   // Construct DATA associated :
   // Find begining of track

   // Find the 0x5224 0x5224 0x5224  first sync
   unsigned int search_offset = 0;
   unsigned int current_recored_offset = 0;

   unsigned char pattern_byte[16];

   if (!abort)
   {
      // Only search the 3 x 0x5224 bytes
      search_offset = FindNextPattern(track_field, disk->side_[side].tracks[tr].size, search_offset, pPatternC2, 6);
      if (search_offset != -1)
      {
         imge_item.start_bit_pos = (search_offset != -1) ? search_offset : 0;
         imge_item.start_byte_pos = imge_item.start_bit_pos / 8;
      }
      else
      {
         search_offset = FindNextSector(track_field, disk->side_[side].tracks[tr].size, search_offset + 1, 8);
         if (search_offset != -1)
         {
            imge_item.start_bit_pos = (search_offset != -1) ? search_offset : 0;
            imge_item.start_byte_pos = imge_item.start_bit_pos / 8;
         }
         else
         {
            // Not a formatted disk : Generate random data
            imge_item.start_bit_pos = 0;
            imge_item.density = 1;
            int dbg = 1;
            //goto End;
            abort = true;
         }
      }
   }

   if (!abort)
   {
      track_field = new unsigned char[disk->side_[side].tracks[tr].size];
      memcpy(track_field, &disk->side_[side].tracks[tr].bitfield[imge_item.start_bit_pos],
             disk->side_[side].tracks[tr].size - imge_item.start_bit_pos);
      memcpy(&track_field[disk->side_[side].tracks[tr].size - imge_item.start_bit_pos],
             disk->side_[side].tracks[tr].bitfield, imge_item.start_bit_pos);

      search_offset = 0;
      int initial_backward_gap = 0;
      unsigned int offset_gap = disk->side_[side].tracks[tr].size - 16;
      while ((offset_gap > current_recored_offset && memcmp(&track_field[offset_gap], pPattern00, 16) == 0)
         && (offset_gap < 1 || track_field[offset_gap - 1] != 1)
      )
      {
         offset_gap -= 16;
         initial_backward_gap++;
      }

      while (search_offset != -1)
      {
         int nb_backward_gap_bytes = 0;
         // Add it : Descriptor, and data
         BlockDescriptor block_descriptor;
         memset(&block_descriptor, 0, sizeof(block_descriptor));

         block_descriptor.block_flag = 0;
         block_descriptor.data_offset = data.offset;
         block_descriptor.sps_specific.gap_offset = gap_data.offset;


         unsigned int search_next_offset = FindNextSector(track_field, disk->side_[side].tracks[tr].size,
                                                          search_offset + 1, 8);
         int end_of_block = 0;
         if (search_next_offset != -1)
         {
            // Next block found : Dont use the '0x00' sync bytes before it - It's the 'backward' gap
            unsigned int offset_gap = search_next_offset - 16;
            nb_backward_gap_bytes = 0;
            while ((offset_gap > search_offset && memcmp(&track_field[offset_gap], pPattern00, 16) == 0)
               && (offset_gap < 1 || track_field[offset_gap - 1] != 1)
            )
            {
               offset_gap -= 16;
               nb_backward_gap_bytes++;
            }
            end_of_block = offset_gap + 16;
         }
         else
         {
            // End block : until the end, then until IMGEitem.start_bit_pos
            nb_backward_gap_bytes = initial_backward_gap;
            end_of_block = disk->side_[side].tracks[tr].size - nb_backward_gap_bytes * 16;
         }

         // What to record : From the next block, until it changed, record the "forward gap"
         memcpy(pattern_byte, &track_field[end_of_block - 16], 16);
         int nb_gap_bytes = 0;
         unsigned int offset_gap = end_of_block - 16;

         // Only if no weak bits in the pattern !
         if (NoWeakBitInPattern(pattern_byte, 16))
         {
            if (pattern_byte[0] == 0
               && pattern_byte[15] == 0
               && (pattern_byte[14] & pattern_byte[1]) == 0
            )
            {
               int dbg = 1;
            }

            while ((offset_gap > search_offset && memcmp(&track_field[offset_gap], pattern_byte, 16) == 0)
               && (((track_field[offset_gap] & track_field[offset_gap - 1]) != 1) || offset_gap - 1 <= search_offset)
               && (offset_gap < 1 || ((track_field[offset_gap - 1] & track_field[offset_gap] & track_field[offset_gap +
                     1]) == 1)
                  && (offset_gap < 2 || (track_field[offset_gap - 1] & track_field[offset_gap] & track_field[offset_gap
                     - 2]) == 1)
               )
            )
            {
               offset_gap -= 16;
               nb_gap_bytes++;
            }
         }
         offset_gap += 16;
         // pPatternByte -> signel byte
         unsigned char byte = IDisk::ConvertMFMToByte(pattern_byte);
         {
            AddGapRecord(&gap_data, nb_gap_bytes, byte);
            block_descriptor.gap_bits += nb_gap_bytes * 16;
            if (nb_backward_gap_bytes > 0)
            {
               AddGapRecord(&gap_data, nb_backward_gap_bytes, 0x00);
               block_descriptor.gap_bits += nb_backward_gap_bytes * 16;
               imge_item.gap_bits += 16 * nb_backward_gap_bytes;
               imge_item.track_byte += nb_backward_gap_bytes * 2;
               block_descriptor.block_flag |= 2;
            }


            imge_item.gap_bits += 16 * nb_gap_bytes;
            imge_item.track_byte += nb_gap_bytes * 2;
            if (nb_gap_bytes > 0)
               block_descriptor.block_flag |= 1;

            // TODO : Adjust at bit value
            // data itself : Add the data (supposed to pPatternC2 + 16 bits (FC most of the time)
            // From searchOffset -> offsetGap;
            bool byte_size = AddStreamRecord(&data, track_field, search_offset, offset_gap,
                                             disk->side_[side].tracks[tr].size);
            imge_item.data_bits += (offset_gap - search_offset);
            imge_item.track_byte += (offset_gap - search_offset + 7) / 8;

            // Block descriptor : End the description
            block_descriptor.block_bits = (offset_gap - search_offset);
            block_descriptor.sps_specific.cell_type = 1;
            block_descriptor.encoder_type = 1;

            if (!byte_size)
               block_descriptor.block_flag |= 4; // in byte. TODO : Use value for bits
            block_descriptor.gap_value = 0x4E;

            list_block_descriptor.push_back(block_descriptor);
            imge_item.block_count++;

            search_offset = search_next_offset;
         }

         // Next blocks
      }

      delete[]track_field;
   }
   // End of track (or unformatted ones !)
   // TODO
   //End:

   // End : Now compile every descriptor, then every datas ( ).
   // dataoffset and gapoffsets
   memcpy(data_chunk.header.type, "DATA", 4);
   data_chunk.header.length = sizeof (data_chunk) - sizeof (unsigned char*); //+ listBlockDescriptor.size() * sizeof(tBlockDescriptor);
   //dataChunk.header.Length += data.Offset + gapData.Offset;
   data_chunk.size = list_block_descriptor.size() * sizeof(BlockDescriptor);
   int final_gap_offset = data_chunk.size;
   int final_data_offset = final_gap_offset + gap_data.offset;

   data_chunk.size += gap_data.offset;
   data_chunk.size += data.offset;
   data_chunk.bit_size = data_chunk.size * 8;

   // Now compile DATA chunks into a buffer
   data_chunk.buffer = new unsigned char[data_chunk.size];
   int final_offset = 0;

   for (std::vector<BlockDescriptor>::iterator it = list_block_descriptor.begin(); it != list_block_descriptor.end(); it
        ++)
   {
      // Adjust gap offset
      it->sps_specific.gap_offset += final_gap_offset;
      // Adjust data offset
      it->data_offset += final_data_offset;

      // Copy block descriptor
      memcpy(&data_chunk.buffer[final_offset], &(*it), sizeof(BlockDescriptor));
      Swap(&data_chunk.buffer[final_offset], sizeof(BlockDescriptor));
      final_offset += sizeof(BlockDescriptor);
   }
   memcpy(&data_chunk.buffer[final_gap_offset], gap_data.buffer, gap_data.offset);
   memcpy(&data_chunk.buffer[final_data_offset], data.buffer, data.offset);

   data_chunk.data_id = imge_item.data_key = datakey;
   data_chunk.data_crc = CRC::ComputeCrc32(0xEDB88320, data_chunk.buffer, data_chunk.size);

   // Now, update IMGE
   imge_item.track_bits = imge_item.gap_bits + imge_item.data_bits;

   if (side < disk->nb_sides_ && tr < disk->side_[side].nb_tracks)
   {
      if (disk->side_[side].tracks[tr].size != imge_item.track_bits)
      {
         // error ?
         int dbg = 1;
      }
   }
   // .. To add

   // CRC
   imge_item.header.crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, (unsigned char*)&imge_item, sizeof(imge_item)));

   list_imge_.push_back(imge_item);
   list_data_.push_back(data_chunk);

   delete []data.buffer;
   delete []gap_data.buffer;

   return 0;
}